

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

bool CheckArgSize(FName *fname,FArgumentList *args,int min,int max,FScriptPosition *sc)

{
  uint uVar1;
  char *pcVar2;
  int s;
  FScriptPosition *sc_local;
  int max_local;
  int min_local;
  FArgumentList *args_local;
  FName *fname_local;
  
  uVar1 = TArray<FxExpression_*,_FxExpression_*>::Size
                    (&args->super_TArray<FxExpression_*,_FxExpression_*>);
  if ((int)uVar1 < min) {
    pcVar2 = FName::GetChars(fname);
    FScriptPosition::Message
              (sc,2,"Insufficient arguments in call to %s, expected %d, got %d",pcVar2,
               (ulong)(uint)min,(ulong)uVar1);
    fname_local._7_1_ = false;
  }
  else if ((max < (int)uVar1) && (-1 < max)) {
    pcVar2 = FName::GetChars(fname);
    FScriptPosition::Message
              (sc,2,"Too many arguments in call to %s, expected %d, got %d",pcVar2,(ulong)(uint)min,
               (ulong)uVar1);
    fname_local._7_1_ = false;
  }
  else {
    fname_local._7_1_ = true;
  }
  return fname_local._7_1_;
}

Assistant:

static bool CheckArgSize(FName fname, FArgumentList &args, int min, int max, FScriptPosition &sc)
{
	int s = args.Size();
	if (s < min)
	{
		sc.Message(MSG_ERROR, "Insufficient arguments in call to %s, expected %d, got %d", fname.GetChars(), min, s);
		return false;
	}
	else if (s > max && max >= 0)
	{
		sc.Message(MSG_ERROR, "Too many arguments in call to %s, expected %d, got %d", fname.GetChars(), min, s);
		return false;
	}
	return true;
}